

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenStringEscapeCode(Lexer *this)

{
  int iVar1;
  uint uVar2;
  Lexer *in_RSI;
  Position *this_00;
  undefined2 local_66;
  undefined1 local_64 [12];
  Position local_58;
  Position local_40;
  
  nextChar(in_RSI);
  uVar2 = in_RSI->currentChar - 0x61;
  if (uVar2 < 0x18) {
    if ((0x2a2023U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_001096af;
    if (uVar2 == 0x17) {
      nextChar(in_RSI);
      iVar1 = isxdigit(in_RSI->currentChar);
      if (iVar1 == 0) {
        local_66 = LEX_ERR_ID_NOT_JUST_ANYS;
        local_64._0_4_ = LEX_ERR_STR_HEXADECIMAL_CHAR;
        getCurrentCursor(&local_58,in_RSI);
        local_40.startIndex = in_RSI->currentEndIndex;
        local_40.line = local_58.line;
        local_40.endIndex = local_40.startIndex;
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)(local_64 + 4),(LexerErrorCode *)&local_66,(Position *)local_64);
      }
      else {
        nextChar(in_RSI);
        iVar1 = isxdigit(in_RSI->currentChar);
        if (iVar1 != 0) goto LAB_001096af;
        local_66 = LEX_ERR_ID_NOT_JUST_ANYS;
        local_64._0_4_ = LEX_ERR_STR_HEXADECIMAL_CHAR;
        getCurrentCursor(&local_58,in_RSI);
        local_40.startIndex = in_RSI->currentEndIndex;
        local_40.line = local_58.line;
        local_40.endIndex = local_40.startIndex;
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)(local_64 + 4),(LexerErrorCode *)&local_66,(Position *)local_64);
      }
      this_00 = (Position *)(local_64 + 4);
      goto LAB_0010975e;
    }
  }
  uVar2 = in_RSI->currentChar - 0x22;
  if ((0x3a < uVar2) || ((0x400000000000021U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    local_64._0_2_ = 2;
    local_64._4_4_ = 3;
    getCurrentCursor(&local_40,in_RSI);
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)&local_58,(LexerErrorCode *)local_64,(Position *)(local_64 + 4));
    this_00 = &local_58;
LAB_0010975e:
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)this_00);
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
LAB_001096af:
  this->_vptr_Lexer = (_func_int **)0x0;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenStringEscapeCode() noexcept {
  nextChar(); // eat '\'
  switch (currentChar) {
  case '\'':
  case '\"':
  case '\\':
  case 'a':
  case 'b':
  case 'f':
  case 'n':
  case 'r':
  case 't':
  case 'v':
    return nullptr;
  case 'x':
    nextChar(); // eat x
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    nextChar(); // eat hex
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    return nullptr;
  default:
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE, getCurrentCursor()));
  }
}